

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O3

span<char> __thiscall libtorrent::aux::receive_buffer::reserve(receive_buffer *this,int size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  span<char> sVar4;
  buffer new_buffer;
  buffer local_48;
  char *local_38;
  
  iVar2 = this->m_recv_end;
  iVar1 = size + iVar2;
  if ((int)(this->m_recv_buffer).m_size < iVar1) {
    iVar3 = this->m_packet_size;
    if (this->m_packet_size < iVar1) {
      iVar3 = iVar1;
    }
    local_38 = (this->m_recv_buffer).m_begin;
    aux::buffer::buffer(&local_48,(long)iVar3);
    if (iVar2 != 0) {
      if (iVar3 < iVar2) {
        iVar2 = iVar3;
      }
      if (iVar2 != 0) {
        memmove(local_48.m_begin,local_38,(long)iVar2);
      }
    }
    if (&local_48 != &this->m_recv_buffer) {
      free((this->m_recv_buffer).m_begin);
      (this->m_recv_buffer).m_begin = local_48.m_begin;
      (this->m_recv_buffer).m_size = local_48.m_size;
      local_48.m_begin = (char *)0x0;
      local_48.m_size = 0;
    }
    (this->m_watermark).m_mean = 0;
    (this->m_watermark).m_average_deviation = 0;
    (this->m_watermark).m_num_samples = 0;
    free(local_48.m_begin);
    iVar2 = this->m_recv_end;
  }
  sVar4.m_len = (long)size;
  sVar4.m_ptr = (this->m_recv_buffer).m_begin + iVar2;
  return sVar4;
}

Assistant:

span<char> receive_buffer::reserve(int const size)
{
	INVARIANT_CHECK;
	TORRENT_ASSERT(size > 0);
	TORRENT_ASSERT(m_recv_pos >= 0);

	// normalize() must be called before receiving more data
	TORRENT_ASSERT(m_recv_start == 0);

	if (int(m_recv_buffer.size()) < m_recv_end + size)
	{
		int const new_size = std::max(m_recv_end + size, m_packet_size);
		buffer new_buffer(new_size, {m_recv_buffer.data(), m_recv_end});
		m_recv_buffer = std::move(new_buffer);

		// since we just increased the size of the buffer, reset the watermark to
		// start at our new size (avoid flapping the buffer size)
		m_watermark = {};
	}

	return span<char>(m_recv_buffer).subspan(m_recv_end, size);
}